

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O0

void __thiscall test_cpp_db_sqlite::test_execute::test_method(test_execute *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  element_type *peVar4;
  int64_t iVar5;
  string *sql;
  value vVar6;
  undefined4 local_5d0;
  allocator<char> local_5c9;
  string local_5c8;
  value local_5a8;
  int64_t local_598;
  basic_cstring<const_char> local_590;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_580;
  basic_cstring<const_char> local_558;
  basic_cstring<const_char> local_548 [7];
  basic_cstring<const_char> local_4d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[82],_const_char_(&)[82]> local_4c0;
  assertion_result local_4a0;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  allocator<char> local_461;
  string local_460;
  undefined4 local_440;
  allocator<char> local_439;
  string local_438;
  value local_418;
  int64_t local_408;
  basic_cstring<const_char> local_400;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3f0;
  basic_cstring<const_char> local_3c8;
  basic_cstring<const_char> local_3b8 [7];
  basic_cstring<const_char> local_340;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[100],_const_char_(&)[100]> local_330;
  assertion_result local_310;
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  int local_2d8;
  allocator<char> local_2d1;
  string local_2d0;
  undefined4 local_2b0;
  char local_2ac [4];
  int local_2a8;
  allocator<char> local_2a1;
  string local_2a0 [32];
  undefined1 local_280 [40];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_258;
  basic_cstring<const_char> local_230;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_200;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  undefined4 local_1b4;
  basic_cstring<const_char> local_1b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1a0;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  any local_158;
  string local_148;
  value local_128;
  undefined1 local_118 [8];
  string names;
  int64_t sum;
  int local_e8;
  allocator<char> local_e1;
  string local_e0;
  result local_c0;
  result r;
  string local_b0;
  value local_90;
  int64_t local_80 [3];
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  test_execute *local_10;
  test_execute *this_local;
  
  local_10 = this;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_20,0x92,&local_30);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar3,(char (*) [1])0x1e7010);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    peVar4 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"select count(*) from TEST_TABLE",
               (allocator<char> *)
               ((long)&r.result_impl._M_t.
                       super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
                       .super__Head_base<0UL,_cpp_db::result_interface_*,_false> + 7));
    cpp_db::execute_scalar<>((cpp_db *)&local_90,peVar4,&local_b0);
    local_80[0] = cpp_db::value_of<long>(&local_90);
    r.result_impl._M_t.
    super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>.
    _M_t.
    super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
    .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl._0_4_ = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_58,&local_68,0x92,1,2,local_80,
               "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE\"))"
               ,&r,"3");
    std::any::~any(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&r.result_impl._M_t.
                       super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
                       .super__Head_base<0UL,_cpp_db::result_interface_*,_false> + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  peVar4 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"select * from TEST_TABLE where COL1 in (?, ?)",&local_e1);
  local_e8 = 1;
  sum._4_4_ = 2;
  cpp_db::execute<int,int>((cpp_db *)&local_c0,peVar4,&local_e0,&local_e8,(int *)((long)&sum + 4));
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  names.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_118);
  while (bVar2 = cpp_db::result::is_eof(&local_c0), ((bVar2 ^ 0xffU) & 1) != 0) {
    cpp_db::result::get_column_value((result *)&local_128,(int)&local_c0);
    iVar5 = cpp_db::value_of<long>(&local_128);
    names.field_2._8_8_ = names.field_2._8_8_ + iVar5;
    std::any::~any(&local_128);
    vVar6 = cpp_db::result::get_column_value((result *)&local_158,(int)&local_c0);
    cpp_db::value_of<std::__cxx11::string>
              (&local_148,(cpp_db *)&local_158,(value *)vVar6._M_storage._M_ptr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               &local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::any::~any(&local_158);
    cpp_db::result::move_next(&local_c0);
  }
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_178);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_168,0x9c,&local_178);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1a0,plVar3,(char (*) [1])0x1e7010);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    local_1b4 = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_1a0,&local_1b0,0x9c,1,2,(undefined1 *)((long)&names.field_2 + 8),"sum",
               &local_1b4,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1c8,0x9d,&local_1d8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_200,plVar3,(char (*) [1])0x1e7010);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
              (&local_200,&local_210,0x9d,1,2,local_118,"names","firstsecond","\"firstsecond\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_200);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_220,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_230);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_220,0x9f,&local_230);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_258,plVar3,(char (*) [1])0x1e7010);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_280 + 0x18),
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    sql = (string *)
          std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_2a0,"select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)",
               &local_2a1);
    local_2a8 = 1;
    local_2ac[0] = '\x02';
    local_2ac[1] = '\0';
    local_2ac[2] = '\0';
    local_2ac[3] = '\0';
    cpp_db::execute_scalar<int,int,char_const(&)[6],char_const(&)[7]>
              ((connection *)local_280,sql,(int *)local_2a0,&local_2a8,(char (*) [6])local_2ac,
               (char (*) [7])"first");
    local_280._16_8_ = cpp_db::value_of<long>((value *)local_280);
    local_2b0 = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_258,local_280 + 0x18,0x9f,1,2,local_280 + 0x10,
               "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)\", 1, 2, \"first\", \"second\"))"
               ,&local_2b0,"2");
    std::any::~any((any *)local_280);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_258);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    peVar4 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"delete from TEST_TABLE where COL1 = ?",&local_2d1);
    local_2d8 = 1;
    cpp_db::execute_non_query<int>(peVar4,&local_2d0,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f8);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2e8,0xa0,&local_2f8);
      boost::test_tools::assertion_result::assertion_result(&local_310,true);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_330,plVar3,
                 (char (*) [100])
                 "no exceptions thrown by cpp_db::execute_non_query(*con, \"delete from TEST_TABLE where COL1 = ?\", 1)"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_340,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::test_tools::tt_detail::report_assertion
                (&local_310,&local_330.super_lazy_ostream,&local_340,0xa0,CHECK,CHECK_MSG,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[100],_const_char_(&)[100]>::
      ~lazy_ostream_impl(&local_330);
      boost::test_tools::assertion_result::~assertion_result(&local_310);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_3b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_3b8,0xa1,&local_3c8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3f0,plVar3,(char (*) [1])0x1e7010);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_400,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    peVar4 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"select count(*) from TEST_TABLE",&local_439);
    cpp_db::execute_scalar<>((cpp_db *)&local_418,peVar4,&local_438);
    local_408 = cpp_db::value_of<long>(&local_418);
    local_440 = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_3f0,&local_400,0xa1,1,2,&local_408,
               "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE\"))"
               ,&local_440,"2");
    std::any::~any(&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    peVar4 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"delete from TEST_TABLE",&local_461);
    cpp_db::execute_non_query<>(peVar4,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_478,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_488);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_478,0xa2,&local_488);
      boost::test_tools::assertion_result::assertion_result(&local_4a0,true);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_4c0,plVar3,
                 (char (*) [82])
                 "no exceptions thrown by cpp_db::execute_non_query(*con, \"delete from TEST_TABLE\")"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_4d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
                 ,0x69);
      boost::test_tools::tt_detail::report_assertion
                (&local_4a0,&local_4c0.super_lazy_ostream,&local_4d0,0xa2,CHECK,CHECK_MSG,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[82],_const_char_(&)[82]>::
      ~lazy_ostream_impl(&local_4c0);
      boost::test_tools::assertion_result::~assertion_result(&local_4a0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_548,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_558);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_548,0xa3,&local_558);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_580,plVar3,(char (*) [1])0x1e7010);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_590,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    peVar4 = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"select count(*) from TEST_TABLE",&local_5c9);
    cpp_db::execute_scalar<>((cpp_db *)&local_5a8,peVar4,&local_5c8);
    local_598 = cpp_db::value_of<long>(&local_5a8);
    local_5d0 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_580,&local_590,0xa3,1,2,&local_598,
               "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE\"))"
               ,&local_5d0,"0");
    std::any::~any(&local_5a8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_580);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_118);
  cpp_db::result::~result(&local_c0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_execute)
{
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 3);
    cpp_db::result r = cpp_db::execute(*con, "select * from TEST_TABLE where COL1 in (?, ?)", 1, 2);
    int64_t sum = 0;
    std::string names;
    while(!r.is_eof())
    {
        sum += cpp_db::value_of<int64_t>(r.get_column_value(0));
        names.append(cpp_db::value_of<std::string>(r.get_column_value(1)));
        r.move_next();
    }
    BOOST_CHECK_EQUAL(sum, 3);
    BOOST_CHECK_EQUAL(names, "firstsecond");

    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)", 1, 2, "first", "second")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE where COL1 = ?", 1));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE"));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 0);
}